

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3191a::QueueReader::~QueueReader(QueueReader *this)

{
  vector<signed_char,_std::allocator<signed_char>_> *pvVar1;
  Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this_00;
  _Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false> local_10;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__QueueReader_00184050;
  pvVar1 = (this->tmp_)._M_t.
           super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
           .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
           _M_head_impl;
  if (pvVar1 != (vector<signed_char,_std::allocator<signed_char>_> *)0x0) {
    this_00 = (this->queue_).
              super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (this->tmp_)._M_t.
    super___uniq_ptr_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    .super__Head_base<0UL,_std::vector<signed_char,_std::allocator<signed_char>_>_*,_false>.
    _M_head_impl = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
    local_10._M_head_impl = pvVar1;
    Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::pushRead
              (this_00,(unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                        *)&local_10);
    std::
    unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                   *)&local_10);
  }
  std::
  unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~unique_ptr(&this->tmp_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->queue_).
              super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  decoder::Reader::~Reader(&this->super_Reader);
  return;
}

Assistant:

virtual ~QueueReader() {
    // Return read buffer if needed
    if (tmp_) {
      queue_->pushRead(std::move(tmp_));
    }
  }